

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

seed_t lest::seed(text *opt,text *arg)

{
  bool bVar1;
  int iVar2;
  runtime_error *this;
  char local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  runtime_error local_80 [16];
  string local_70 [48];
  string local_40 [32];
  text *local_20;
  text *arg_local;
  text *opt_local;
  
  local_20 = arg;
  arg_local = opt;
  bVar1 = std::operator==(arg,"time");
  if (bVar1) {
    opt_local = (text *)time((time_t *)0x0);
  }
  else {
    std::__cxx11::string::string(local_40,(string *)arg);
    bVar1 = is_number((text *)local_40);
    std::__cxx11::string::~string(local_40);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "expecting \'time\' or positive number with option \'");
      std::operator+(local_e0,local_100);
      std::operator+(local_c0,local_e0);
      std::operator+(local_a0,(char *)local_c0);
      std::runtime_error::runtime_error(local_80,(string *)local_a0);
      std::runtime_error::runtime_error(this,local_80);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string(local_70,(string *)arg);
    iVar2 = stoi((text *)local_70);
    opt_local = (text *)(long)iVar2;
    std::__cxx11::string::~string(local_70);
  }
  return (seed_t)opt_local;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    // std::time_t: implementation dependent

    if ( arg == "time" )
        return static_cast<seed_t>( time( lest_nullptr ) );

    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}